

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yang_print_must(lyout *out,int level,lys_module *module,lys_restr *must)

{
  char *value;
  char *str;
  lys_restr *must_local;
  lys_module *module_local;
  int level_local;
  lyout *out_local;
  
  value = transform_json2schema(module,must->expr);
  if (value == (char *)0x0) {
    ly_print(out,"(!error!)");
  }
  else {
    yang_print_restr(out,level,module,must,"must",value);
    lydict_remove(module->ctx,value);
  }
  return;
}

Assistant:

static void
yang_print_must(struct lyout *out, int level, const struct lys_module *module, const struct lys_restr *must)
{
    const char *str;

    str = transform_json2schema(module, must->expr);
    if (!str) {
        ly_print(out, "(!error!)");
        return;
    }
    yang_print_restr(out, level, module, must, "must", str);
    lydict_remove(module->ctx, str);
}